

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O1

ssize_t Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<432U,_Fixpp::Type::String>_>_>::write
                  (int __fd,void *__buf,size_t __n)

{
  ostream *poVar1;
  undefined4 in_register_0000003c;
  size_type *local_48;
  Type value;
  
  local_48 = &value._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,*__buf,*(long *)((long)__buf + 8) + *__buf);
  poVar1 = std::ostream::_M_insert<unsigned_long>(CONCAT44(in_register_0000003c,__fd));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"=",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)local_48,(long)value._M_dataplus._M_p);
  value.field_2._M_local_buf[0xf] = '|';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,value.field_2._M_local_buf + 0xf,1);
  if (local_48 != &value._M_string_length) {
    operator_delete(local_48,value._M_string_length + 1);
  }
  return CONCAT44(in_register_0000003c,__fd);
}

Assistant:

static std::ostream& write(std::ostream& os, const Field& field)
        {
            auto value = field.get();
            os << Field::Tag::Id << "=" << value << SOH;
            return os;
        }